

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int LSolve(N_Vector b,void *mem)

{
  long in_RSI;
  undefined8 in_RDI;
  IntegratorMem Imem;
  int retval;
  int local_4;
  
  if (in_RSI == 0) {
    printf("ERROR: Integrator memory is NULL");
    local_4 = -1;
  }
  else {
    local_4 = SUNLinSolSolve(0,*(undefined8 *)(in_RSI + 0x30),*(undefined8 *)(in_RSI + 0x28),
                             *(undefined8 *)(in_RSI + 0x20),in_RDI);
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RSI + 0x20),in_RDI);
  }
  return local_4;
}

Assistant:

int LSolve(N_Vector b, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  retval = SUNLinSolSolve(Imem->LS, Imem->A, Imem->x, b, ZERO);
  N_VScale(ONE, Imem->x, b);

  return (retval);
}